

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_getimage.c
# Opt level: O2

int buildMap(TIFFRGBAImage *img)

{
  ushort *puVar1;
  ushort uVar2;
  uint16_t *puVar3;
  uint16_t *puVar4;
  uint16_t *puVar5;
  undefined1 auVar6 [16];
  uint uVar7;
  uint16_t *r;
  TIFFRGBValue *pTVar8;
  uint32_t **ppuVar9;
  undefined1 (*pauVar10) [16];
  char *pcVar11;
  byte bVar12;
  sbyte sVar13;
  int iVar14;
  ulong uVar15;
  ulong uVar16;
  uint16_t *g;
  char *fmt;
  uint uVar17;
  uint32_t **ppuVar18;
  undefined1 (*pauVar19) [16];
  uint uVar20;
  sbyte sVar21;
  uint16_t *b;
  tmsize_t s;
  ulong uVar22;
  long lVar23;
  ulong uVar24;
  long lVar25;
  ulong uVar26;
  uint32_t **ppuVar27;
  undefined1 (*pauVar28) [16];
  TIFF *pTVar29;
  ulong uVar30;
  undefined1 auVar31 [14];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  long lStack_70;
  long local_60;
  undefined1 (*local_58) [16];
  ulong local_50;
  long local_40;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  
  uVar2 = img->photometric;
  if (6 < uVar2) {
    return 1;
  }
  if ((100U >> (uVar2 & 0x1f) & 1) == 0) {
    if ((3U >> (uVar2 & 0x1f) & 1) == 0) {
      if (uVar2 != 3) {
        return 1;
      }
      puVar3 = img->redcmap;
      puVar4 = img->greencmap;
      puVar5 = img->bluecmap;
      bVar12 = (byte)img->bitspersample;
      lVar23 = 1L << (bVar12 & 0x3f);
      lVar25 = 0;
      do {
        if (lVar23 < 1) {
          pTVar29 = img->tif;
          pcVar11 = TIFFFileName(pTVar29);
          TIFFWarningExtR(pTVar29,pcVar11,"Assuming 8-bit colormap");
          goto LAB_0025cce8;
        }
        if ((0xff < *(ushort *)((long)puVar3 + lVar25)) ||
           (0xff < *(ushort *)((long)puVar4 + lVar25))) break;
        lVar23 = lVar23 + -1;
        puVar1 = (ushort *)((long)puVar5 + lVar25);
        lVar25 = lVar25 + 2;
      } while (*puVar1 < 0x100);
      for (uVar24 = ~(-1L << (bVar12 & 0x3f)); -1 < (long)uVar24; uVar24 = uVar24 - 1) {
        puVar3[uVar24] = (ushort)*(byte *)((long)puVar3 + uVar24 * 2 + 1);
        puVar4[uVar24] = (ushort)*(byte *)((long)puVar4 + uVar24 * 2 + 1);
        puVar5[uVar24] = (ushort)*(byte *)((long)puVar5 + uVar24 * 2 + 1);
      }
LAB_0025cce8:
      uVar2 = img->bitspersample;
      uVar24 = (ulong)uVar2;
      if (8 < uVar2) {
        return 1;
      }
      puVar3 = img->redcmap;
      puVar4 = img->greencmap;
      puVar5 = img->bluecmap;
      ppuVar9 = (uint32_t **)
                _TIFFmallocExt(img->tif,(ulong)(byte)(8 / (uVar2 & 0xff)) * 0x400 + 0x800);
      img->PALmap = ppuVar9;
      auVar6 = _DAT_002e7a70;
      if (ppuVar9 != (uint32_t **)0x0) {
        pauVar10 = (undefined1 (*) [16])(ppuVar9 + 0x100);
        uVar30 = 0;
        do {
          if (uVar30 == 0x100) {
            return 1;
          }
          img->PALmap[uVar30] = (uint32_t *)pauVar10;
          local_50 = uVar24;
          switch(uVar2) {
          case 1:
            uVar15 = uVar30 >> 7 & 0x1ffffff;
            uVar16 = (ulong)((uint)(uVar30 >> 5) & 2);
            uVar22 = (ulong)((uint)(uVar30 >> 4) & 2);
            uVar26 = (ulong)((uint)(uVar30 >> 3) & 2);
            auVar31._2_2_ = *(undefined2 *)((long)puVar3 + uVar16);
            auVar31._0_2_ = puVar3[uVar15];
            auVar31._4_2_ = *(undefined2 *)((long)puVar3 + uVar22);
            auVar31._6_2_ = *(undefined2 *)((long)puVar3 + uVar26);
            local_58 = pauVar10 + 1;
            auVar31._8_6_ = 0;
            auVar32._2_2_ = *(undefined2 *)((long)puVar4 + uVar16);
            auVar32._0_2_ = puVar4[uVar15];
            auVar32._4_2_ = *(undefined2 *)((long)puVar4 + uVar22);
            auVar32._6_2_ = *(undefined2 *)((long)puVar4 + uVar26);
            auVar32._8_8_ = 0;
            auVar32 = psllw(auVar32,8);
            auVar31 = auVar32._0_14_ | auVar31 & SUB1614(ZEXT816(0xff00ff00ff00ff),0);
            auVar36._0_12_ = auVar31._0_12_;
            auVar36._12_2_ = auVar31._6_2_;
            auVar36._14_2_ = *(undefined2 *)((long)puVar5 + uVar26);
            auVar35._12_4_ = auVar36._12_4_;
            auVar35._0_10_ = auVar31._0_10_;
            auVar35._10_2_ = *(undefined2 *)((long)puVar5 + uVar22);
            auVar34._10_6_ = auVar35._10_6_;
            auVar34._0_8_ = auVar31._0_8_;
            auVar34._8_2_ = auVar31._4_2_;
            auVar33._8_8_ = auVar34._8_8_;
            auVar33._6_2_ = *(undefined2 *)((long)puVar5 + uVar16);
            auVar33._4_2_ = auVar31._2_2_;
            auVar33._0_2_ = auVar31._0_2_;
            auVar33._2_2_ = puVar5[uVar15];
            *pauVar10 = auVar33 | auVar6;
            sVar13 = 3;
            uVar17 = 1;
            local_40 = 0x14;
            sVar21 = 2;
            lVar25 = 0x18;
            local_50 = 1;
            uVar15 = 0x1c;
            lStack_70 = 0x20;
            uVar7 = uVar17;
            break;
          case 2:
            uVar17 = 0x3ffffff;
            sVar13 = 6;
            sVar21 = 4;
            local_40 = 4;
            lVar25 = 8;
            uVar15 = 0xc;
            lStack_70 = 0x10;
            local_58 = pauVar10;
            uVar7 = 3;
            break;
          default:
            goto switchD_0025cd81_caseD_3;
          case 4:
            uVar7 = 0xfffffff;
            lStack_70 = 8;
            uVar15 = uVar24;
            pauVar28 = pauVar10;
            uVar17 = 0xf;
            goto LAB_0025cf2f;
          case 8:
            lStack_70 = 4;
            pauVar19 = pauVar10;
            uVar15 = uVar30;
            goto LAB_0025cf74;
          }
          uVar16 = (ulong)((uVar17 & (uint)(uVar30 >> sVar13)) * 2);
          *(uint *)*local_58 =
               (uint)*(ushort *)((long)puVar5 + uVar16) << 0x10 |
               (*(ushort *)((long)puVar4 + uVar16) & 0xff) << 8 |
               (uint)*(byte *)((long)puVar3 + uVar16) | 0xff000000;
          uVar16 = (ulong)((uVar7 & (uint)(uVar30 >> sVar21)) * 2);
          pauVar28 = (undefined1 (*) [16])((long)*pauVar10 + lVar25);
          *(uint *)((long)*pauVar10 + local_40) =
               (uint)*(ushort *)((long)puVar5 + uVar16) << 0x10 |
               (*(ushort *)((long)puVar4 + uVar16) & 0xff) << 8 |
               (uint)*(byte *)((long)puVar3 + uVar16) | 0xff000000;
          uVar17 = uVar7;
LAB_0025cf2f:
          uVar16 = (ulong)((uVar7 & (uint)(uVar30 >> ((byte)local_50 & 0x3f))) * 2);
          pauVar19 = (undefined1 (*) [16])((long)*pauVar10 + uVar15);
          *(uint *)*pauVar28 =
               (uint)*(ushort *)((long)puVar5 + uVar16) << 0x10 |
               (*(ushort *)((long)puVar4 + uVar16) & 0xff) << 8 |
               (uint)*(byte *)((long)puVar3 + uVar16) | 0xff000000;
          uVar15 = (ulong)(uVar17 & (uint)uVar30);
LAB_0025cf74:
          pauVar10 = (undefined1 (*) [16])((long)*pauVar10 + lStack_70);
          *(uint *)*pauVar19 =
               (uint)puVar5[uVar15] << 0x10 |
               (puVar4[uVar15] & 0xff) << 8 | (uint)(byte)puVar3[uVar15] | 0xff000000;
switchD_0025cd81_caseD_3:
          uVar30 = uVar30 + 1;
        } while( true );
      }
      pTVar29 = img->tif;
      pcVar11 = TIFFFileName(pTVar29);
      fmt = "No space for Palette mapping table";
      goto LAB_0025ca4f;
    }
  }
  else if (img->bitspersample == 8) {
    return 1;
  }
  uVar17 = 0xff;
  if (img->bitspersample != 0x10) {
    uVar17 = ~(uint)(-1L << ((byte)img->bitspersample & 0x3f));
  }
  pTVar8 = (TIFFRGBValue *)_TIFFmallocExt(img->tif,(long)(int)(uVar17 + 1));
  img->Map = pTVar8;
  if (pTVar8 == (TIFFRGBValue *)0x0) {
    pTVar29 = img->tif;
    pcVar11 = TIFFFileName(pTVar29);
    fmt = "No space for photometric conversion table";
  }
  else {
    uVar7 = 0xffffffff;
    if (-1 < (int)uVar17) {
      uVar7 = uVar17;
    }
    if (img->photometric == 0) {
      iVar14 = uVar17 * 0xff;
      for (lVar25 = 0; (long)(int)uVar7 + 1 != lVar25; lVar25 = lVar25 + 1) {
        img->Map[lVar25] = (TIFFRGBValue)(iVar14 / (int)uVar17);
        iVar14 = iVar14 + -0xff;
      }
    }
    else {
      iVar14 = 0;
      for (lVar25 = 0; (long)(int)uVar7 + 1 != lVar25; lVar25 = lVar25 + 1) {
        img->Map[lVar25] = (TIFFRGBValue)(iVar14 / (int)uVar17);
        iVar14 = iVar14 + 0xff;
      }
    }
    uVar2 = img->bitspersample;
    uVar24 = (ulong)uVar2;
    if (0x10 < uVar2) {
      return 1;
    }
    if (1 < img->photometric) {
      return 1;
    }
    pTVar8 = img->Map;
    s = 0xc00;
    if (uVar2 < 9) {
      s = (ulong)(byte)(8 / (uVar2 & 0xff)) * 0x400 + 0x800;
    }
    ppuVar9 = (uint32_t **)_TIFFmallocExt(img->tif,s);
    img->BWmap = ppuVar9;
    if (ppuVar9 != (uint32_t **)0x0) {
      ppuVar9 = ppuVar9 + 0x100;
      uVar30 = 0;
      do {
        if (uVar30 == 0x100) {
          _TIFFfreeExt(img->tif,img->Map);
          img->Map = (TIFFRGBValue *)0x0;
          return 1;
        }
        img->BWmap[uVar30] = (uint32_t *)ppuVar9;
        uVar17 = (uint)uVar30;
        uVar15 = uVar24;
        switch(uVar2) {
        case 1:
          *(uint *)ppuVar9 = (uint)pTVar8[uVar30 >> 7 & 0x1ffffff] * 0x10101 | 0xff000000;
          *(uint *)((long)ppuVar9 + 4) = (uint)pTVar8[(uVar17 >> 6 & 1) != 0] * 0x10101 | 0xff000000
          ;
          *(uint *)(ppuVar9 + 1) = (uint)pTVar8[(uVar17 >> 5 & 1) != 0] * 0x10101 | 0xff000000;
          ppuVar18 = ppuVar9 + 2;
          *(uint *)((long)ppuVar9 + 0xc) =
               (uint)pTVar8[(uVar17 >> 4 & 1) != 0] * 0x10101 | 0xff000000;
          sVar13 = 3;
          uVar15 = 1;
          uVar7 = 1;
          local_60 = 0x14;
          sVar21 = 2;
          lVar25 = 0x18;
          uVar16 = 0x1c;
          lStack_70 = 0x20;
          uVar20 = uVar7;
          goto LAB_0025cbfd;
        case 2:
          uVar7 = 0x3ffffff;
          sVar13 = 6;
          sVar21 = 4;
          local_60 = 4;
          lVar25 = 8;
          uVar16 = 0xc;
          lStack_70 = 0x10;
          ppuVar18 = ppuVar9;
          uVar20 = 3;
LAB_0025cbfd:
          *(uint *)ppuVar18 = (uint)pTVar8[uVar7 & (uint)(uVar30 >> sVar13)] * 0x10101 | 0xff000000;
          ppuVar27 = (uint32_t **)(lVar25 + (long)ppuVar9);
          *(uint *)((long)ppuVar9 + local_60) =
               (uint)pTVar8[uVar20 & (uint)(uVar30 >> sVar21)] * 0x10101 | 0xff000000;
          uVar7 = uVar20;
LAB_0025cc69:
          ppuVar18 = (uint32_t **)(uVar16 + (long)ppuVar9);
          *(uint *)ppuVar27 =
               (uint)pTVar8[uVar20 & (uint)(uVar30 >> ((byte)uVar15 & 0x3f))] * 0x10101 | 0xff000000
          ;
          uVar15 = (ulong)(uVar7 & uVar17);
LAB_0025cc92:
          ppuVar9 = (uint32_t **)((long)ppuVar9 + lStack_70);
          *(uint *)ppuVar18 = (uint)pTVar8[uVar15] * 0x10101 | 0xff000000;
          break;
        case 3:
        case 5:
        case 6:
        case 7:
          break;
        case 4:
          uVar20 = 0xfffffff;
          lStack_70 = 8;
          uVar16 = uVar24;
          ppuVar27 = ppuVar9;
          uVar7 = 0xf;
          goto LAB_0025cc69;
        case 8:
switchD_0025cb27_caseD_8:
          lStack_70 = 4;
          ppuVar18 = ppuVar9;
          uVar15 = uVar30;
          goto LAB_0025cc92;
        default:
          if (uVar2 == 0x10) goto switchD_0025cb27_caseD_8;
        }
        uVar30 = uVar30 + 1;
      } while( true );
    }
    pTVar29 = img->tif;
    pcVar11 = TIFFFileName(pTVar29);
    fmt = "No space for B&W mapping table";
  }
LAB_0025ca4f:
  TIFFErrorExtR(pTVar29,pcVar11,fmt);
  return 0;
}

Assistant:

static int buildMap(TIFFRGBAImage *img)
{
    switch (img->photometric)
    {
        case PHOTOMETRIC_RGB:
        case PHOTOMETRIC_YCBCR:
        case PHOTOMETRIC_SEPARATED:
            if (img->bitspersample == 8)
                break;
            /* fall through... */
        case PHOTOMETRIC_MINISBLACK:
        case PHOTOMETRIC_MINISWHITE:
            if (!setupMap(img))
                return (0);
            break;
        case PHOTOMETRIC_PALETTE:
            /*
             * Convert 16-bit colormap to 8-bit (unless it looks
             * like an old-style 8-bit colormap).
             */
            if (checkcmap(img) == 16)
                cvtcmap(img);
            else
                TIFFWarningExtR(img->tif, TIFFFileName(img->tif),
                                "Assuming 8-bit colormap");
            /*
             * Use mapping table and colormap to construct
             * unpacking tables for samples < 8 bits.
             */
            if (img->bitspersample <= 8 && !makecmap(img))
                return (0);
            break;
    }
    return (1);
}